

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::BasicTexImageCubeArrayCase::createTexture
          (BasicTexImageCubeArrayCase *this)

{
  int depth;
  int internalFormat;
  deUint32 seed;
  int width;
  char *str;
  TransferFormat TVar1;
  void *data;
  PixelBufferAccess local_f8;
  PixelBufferAccess local_d0;
  undefined1 local_a8 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelW;
  int ndx;
  undefined1 local_78 [8];
  TextureLevel levelData;
  deUint32 local_34;
  deUint32 dStack_30;
  TransferFormat transferFmt;
  Random rnd;
  deUint32 tex;
  BasicTexImageCubeArrayCase *this_local;
  
  rnd.m_rnd.z = 0;
  unique0x10000450 = this;
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)&transferFmt,seed);
  TVar1 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  local_34 = TVar1.format;
  dStack_30 = TVar1.dataType;
  _levelW = glu::mapGLTransferFormat(local_34,dStack_30);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_78,(TextureFormat *)&levelW);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             &rnd.m_rnd.z);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,rnd.m_rnd.z);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf5,1);
  for (gMin.m_data[3] = 0.0;
      (int)gMin.m_data[3] < (this->super_TextureCubeArraySpecCase).m_numLevels;
      gMin.m_data[3] = (float)((int)gMin.m_data[3] + 1)) {
    width = de::max<int>(1,(this->super_TextureCubeArraySpecCase).m_size >>
                           (gMin.m_data[3]._0_1_ & 0x1f));
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)&transferFmt,
                    &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_a8,(Random *)&transferFmt,
                    &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax);
    tcu::TextureLevel::setSize
              ((TextureLevel *)local_78,width,width,(this->super_TextureCubeArraySpecCase).m_depth);
    tcu::TextureLevel::getAccess(&local_d0,(TextureLevel *)local_78);
    tcu::fillWithComponentGradients(&local_d0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_a8);
    depth = (this->super_TextureCubeArraySpecCase).m_depth;
    internalFormat = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
    tcu::TextureLevel::getAccess(&local_f8,(TextureLevel *)local_78);
    data = tcu::PixelBufferAccess::getDataPtr(&local_f8);
    sglr::ContextWrapper::glTexImage3D
              (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
               0x9009,(int)gMin.m_data[3],internalFormat,width,width,depth,0,local_34,dStack_30,data
              );
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_78);
  de::Random::~Random((Random *)&transferFmt);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex			= 0;
		de::Random				rnd			(deStringHash(getName()));
		glu::TransferFormat		transferFmt	= glu::getTransferFormat(m_texFormat);
		tcu::TextureLevel		levelData	(glu::mapGLTransferFormat(transferFmt.format, transferFmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_size	>> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelW, m_depth);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, m_internalFormat, levelW, levelW, m_depth, 0, transferFmt.format, transferFmt.dataType, levelData.getAccess().getDataPtr());
		}
	}